

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::basis_validate_output_buffer_size
               (transcoder_texture_format target_format,
               uint32_t output_blocks_buf_size_in_blocks_or_pixels,uint32_t orig_width,
               uint32_t orig_height,uint32_t output_row_pitch_in_blocks_or_pixels,
               uint32_t output_rows_in_pixels,uint32_t total_slice_blocks)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  transcoder_texture_format in_EDI;
  int in_R8D;
  int in_R9D;
  uint32_t total_blocks_fxt1;
  uint32_t num_blocks_fxt1_y;
  uint32_t num_blocks_fxt1_x;
  int local_1c;
  int local_18;
  
  bVar1 = basis_transcoder_format_is_uncompressed(in_EDI);
  if (bVar1) {
    local_18 = in_R8D;
    if (in_R8D == 0) {
      local_18 = in_EDX;
    }
    local_1c = in_R9D;
    if (in_R9D == 0) {
      local_1c = in_ECX;
    }
    if (in_ESI < (uint)(local_1c * local_18)) {
      return false;
    }
  }
  else if (in_EDI == cTFFXT1_RGB) {
    if (in_ESI < (in_EDX + 7U >> 3) * (in_ECX + 3U >> 2)) {
      return false;
    }
  }
  else if (in_ESI < num_blocks_fxt1_x) {
    return false;
  }
  return true;
}

Assistant:

bool basis_validate_output_buffer_size(transcoder_texture_format target_format,
		uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		uint32_t orig_width, uint32_t orig_height,
		uint32_t output_row_pitch_in_blocks_or_pixels,
		uint32_t output_rows_in_pixels,
		uint32_t total_slice_blocks)
	{
		if (basis_transcoder_format_is_uncompressed(target_format))
		{
			// Assume the output buffer is orig_width by orig_height
			if (!output_row_pitch_in_blocks_or_pixels)
				output_row_pitch_in_blocks_or_pixels = orig_width;

			if (!output_rows_in_pixels) 
				output_rows_in_pixels = orig_height;

			// Now make sure the output buffer is large enough, or we'll overwrite memory.
			if (output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels))
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels)\n");
				return false;
			}
		}
		else if (target_format == transcoder_texture_format::cTFFXT1_RGB)
		{
			const uint32_t num_blocks_fxt1_x = (orig_width + 7) / 8;
			const uint32_t num_blocks_fxt1_y = (orig_height + 3) / 4;
			const uint32_t total_blocks_fxt1 = num_blocks_fxt1_x * num_blocks_fxt1_y;

			if (output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1\n");
				return false;
			}
		}
		else
		{
			if (output_blocks_buf_size_in_blocks_or_pixels < total_slice_blocks)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: output_blocks_buf_size_in_blocks_or_pixels < transcode_image\n");
				return false;
			}
		}
		return true;
	}